

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

void __thiscall llvm::detail::IEEEFloat::initFromFloatAPInt(IEEEFloat *this,APInt *api)

{
  byte bVar1;
  ulong uVar2;
  Significand SVar3;
  int iVar4;
  ulong uVar5;
  byte bVar6;
  
  if (api->BitWidth != 0x20) {
    __assert_fail("api.getBitWidth()==32",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xc60,"void llvm::detail::IEEEFloat::initFromFloatAPInt(const APInt &)");
  }
  uVar2 = (api->U).VAL;
  uVar5 = uVar2 >> 0x17 & 0xff;
  this->semantics = (fltSemantics *)semIEEEsingle;
  bVar1 = this->field_0x12;
  bVar6 = (byte)(uVar2 >> 0x1c) & 8;
  iVar4 = (int)uVar5;
  if (iVar4 == 0 && (uVar2 & 0x7fffff) == 0) {
    bVar6 = bVar1 & 0xf0 | bVar6 | 3;
  }
  else {
    if (iVar4 != 0xff || (uVar2 & 0x7fffff) != 0) {
      bVar6 = bVar1 & 0xf0 | bVar6;
      if ((uVar2 & 0x7fffff) == 0 || iVar4 != 0xff) {
        uVar2 = (ulong)((uint)uVar2 & 0x7fffff);
        this->field_0x12 = bVar6 | 2;
        this->exponent = (short)uVar5 + -0x7f;
        (this->significand).part = uVar2;
        if (iVar4 == 0) {
          this->exponent = -0x7e;
          return;
        }
        SVar3.part = uVar2 | 0x800000;
      }
      else {
        this->field_0x12 = bVar6 | 1;
        SVar3._0_4_ = (uint)uVar2 & 0x7fffff;
        SVar3.part._4_4_ = 0;
      }
      this->significand = SVar3;
      return;
    }
    bVar6 = bVar1 & 0xf0 | bVar6;
  }
  this->field_0x12 = bVar6;
  return;
}

Assistant:

void IEEEFloat::initFromFloatAPInt(const APInt &api) {
  assert(api.getBitWidth()==32);
  uint32_t i = (uint32_t)*api.getRawData();
  uint32_t myexponent = (i >> 23) & 0xff;
  uint32_t mysignificand = i & 0x7fffff;

  initialize(&semIEEEsingle);
  assert(partCount()==1);

  sign = i >> 31;
  if (myexponent==0 && mysignificand==0) {
    // exponent, significand meaningless
    category = fcZero;
  } else if (myexponent==0xff && mysignificand==0) {
    // exponent, significand meaningless
    category = fcInfinity;
  } else if (myexponent==0xff && mysignificand!=0) {
    // sign, exponent, significand meaningless
    category = fcNaN;
    *significandParts() = mysignificand;
  } else {
    category = fcNormal;
    exponent = myexponent - 127;  //bias
    *significandParts() = mysignificand;
    if (myexponent==0)    // denormal
      exponent = -126;
    else
      *significandParts() |= 0x800000; // integer bit
  }
}